

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O3

void __thiscall psy::C::SemanticModelTester::case0002(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DeclarationCategory DVar2;
  SymbolKind SVar3;
  TypeKind TVar4;
  BasicTypeKind BVar5;
  int iVar6;
  DeclaratorSyntax *node;
  Symbol *this_00;
  undefined4 extraout_var;
  Lexeme *pLVar7;
  Type *pTVar8;
  undefined4 extraout_var_00;
  ostream *poVar9;
  undefined4 extraout_var_01;
  undefined8 uVar10;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  SemanticModel *local_30;
  TestSuite *local_28;
  ObjectDeclarationSymbol *this_01;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"int ( x ) ;","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffd0,(string *)this,&local_70);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  node = (DeclaratorSyntax *)(**(code **)(*(long *)local_28[6]._vptr_TestSuite[1] + 0x2a0))();
  this_00 = &SemanticModel::declarationBy(local_30,node)->super_Symbol;
  if (this_00 == (Symbol *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpression is NOT ");
    poVar9 = std::operator<<(poVar9,"true");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    iVar6 = 0x75;
  }
  else {
    DVar2 = DeclarationSymbol::category((DeclarationSymbol *)this_00);
    if (DVar2 == Object) {
      SVar3 = Symbol::kind(this_00);
      if (SVar3 == VariableDeclaration) {
        iVar6 = (*this_00->_vptr_Symbol[0xd])(this_00);
        this_01 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var,iVar6);
        pLVar7 = &ObjectDeclarationSymbol::name(this_01)->super_Lexeme;
        Lexeme::valueText_abi_cxx11_(&local_70,pLVar7);
        iVar6 = std::__cxx11::string::compare((char *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (iVar6 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tActual  : ",0xc);
          pLVar7 = &ObjectDeclarationSymbol::name(this_01)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_70,pLVar7);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_70._M_dataplus._M_p,
                              local_70._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\tExpected: ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                     ,99);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x79);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__cxx11::string::~string((string *)&local_70);
          goto LAB_003d7257;
        }
        pTVar8 = ObjectDeclarationSymbol::type(this_01);
        TVar4 = Type::kind(pTVar8);
        if (TVar4 == Basic) {
          pTVar8 = ObjectDeclarationSymbol::type(this_01);
          iVar6 = (*pTVar8->_vptr_Type[5])(pTVar8);
          BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar6));
          if (BVar5 == Int_S) {
            return;
          }
          poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
          pTVar8 = ObjectDeclarationSymbol::type(this_01);
          iVar6 = (*pTVar8->_vptr_Type[5])(pTVar8);
          BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar6));
          poVar9 = C::operator<<(poVar9,BVar5);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
          poVar9 = C::operator<<(poVar9,Int_S);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\t");
          poVar9 = std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          iVar6 = 0x7b;
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
          pTVar8 = ObjectDeclarationSymbol::type(this_01);
          TVar4 = Type::kind(pTVar8);
          poVar9 = ::operator<<(poVar9,TVar4);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
          poVar9 = ::operator<<(poVar9,Basic);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\t");
          poVar9 = std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          iVar6 = 0x7a;
        }
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
        SVar3 = Symbol::kind(this_00);
        poVar9 = C::operator<<(poVar9,SVar3);
        poVar9 = std::operator<<(poVar9,"\n");
        poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
        poVar9 = C::operator<<(poVar9,VariableDeclaration);
        poVar9 = std::operator<<(poVar9,"\n");
        poVar9 = std::operator<<(poVar9,"\t\t");
        poVar9 = std::operator<<(poVar9,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                );
        poVar9 = std::operator<<(poVar9,":");
        iVar6 = 0x77;
      }
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
      DVar2 = DeclarationSymbol::category((DeclarationSymbol *)this_00);
      poVar9 = C::operator<<(poVar9,DVar2);
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
      poVar9 = C::operator<<(poVar9,Object);
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,"\t\t");
      poVar9 = std::operator<<(poVar9,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar9 = std::operator<<(poVar9,":");
      iVar6 = 0x76;
    }
  }
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar6);
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_003d7257:
  uVar10 = __cxa_allocate_exception(1);
  __cxa_throw(uVar10,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0002()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("int ( x ) ;");

    auto decltor = varAndOrFunDeclNode->declarators()->value;
    auto parenDecltor = decltor->asParenthesizedDeclarator();
    const DeclarationSymbol* declSym = semaModel->declarationBy(parenDecltor);
    PSY_EXPECT_TRUE(declSym);
    PSY_EXPECT_EQ_ENU(declSym->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym = declSym->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(varDeclSym->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(varDeclSym->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);
}